

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lines.hpp
# Opt level: O2

type just::lines::
     split<false,std::__cxx11::string,std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *out_)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  undefined1 local_98 [24];
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  undefined1 local_58 [64];
  
  begin_lines<false,std::__cxx11::string>
            ((iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              *)local_58,(lines *)s_,in_RDX);
  local_98._0_8_ = (char *)0x0;
  local_98._8_8_ = (char *)0x0;
  local_98[0x10] = true;
  local_80._M_p = (pointer)&local_70;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  std::
  copy<just::lines::iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,false>,std::back_insert_iterator<std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              *)local_58,
             (iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
              *)local_98,
             (back_insert_iterator<std::__cxx11::list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )out_);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)(local_58 + 0x18));
  return;
}

Assistant:

typename impl::ignore_second<void, typename String::const_iterator>::type
    split(const String& s_, Container& out_)
    {
      std::copy(
        begin_lines<KeepNewlines>(s_),
        end_lines<KeepNewlines>(s_),
        std::back_inserter(out_)
      );
    }